

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

int AF_AWeapon_CheckAmmo
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  AWeapon *this;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_004a442d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004a441d:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004a442d:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2ae,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AWeapon *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AWeapon *)0x0) goto LAB_004a434a;
    bVar3 = DObject::IsKindOf((DObject *)this,AWeapon::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AWeapon))";
      goto LAB_004a442d;
    }
  }
  else {
    if (this != (AWeapon *)0x0) goto LAB_004a441d;
LAB_004a434a:
    this = (AWeapon *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_004a4455:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2af,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_004a4455;
  }
  if ((uint)numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
LAB_004a447d:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2b0,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_004a447d;
  }
  pVVar1 = param + 1;
  pVVar2 = param + 2;
  if (numparam == 3) {
    param = defaultparam->Array;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004a44e3:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b1,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar3 = param[3].field_0.i != 0;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_004a44e3;
    }
    bVar3 = param[3].field_0.i != 0;
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_004a449c;
      }
      goto LAB_004a43d9;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004a449c:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2b2,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_004a43d9:
  bVar3 = AWeapon::CheckAmmo(this,(pVVar1->field_0).i,(pVVar2->field_0).i != 0,bVar3,
                             param[4].field_0.i);
  if (numret < 1) {
    iVar4 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b3,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,(uint)bVar3);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

DEFINE_ACTION_FUNCTION(AWeapon, CheckAmmo)
{
	PARAM_SELF_PROLOGUE(AWeapon);
	PARAM_INT(mode);
	PARAM_BOOL(autoswitch);
	PARAM_BOOL_DEF(require);
	PARAM_INT_DEF(ammocnt);
	ACTION_RETURN_BOOL(self->CheckAmmo(mode, autoswitch, require, ammocnt));
}